

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

void __thiscall MP1Node::updateMembershipList(MP1Node *this,int id,short port,long heartbeat)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  long lVar5;
  Address local_46;
  undefined1 auStack_40 [2];
  Address logAddr;
  MemberListEntry entry;
  int i;
  int sizeOfMemberList;
  long heartbeat_local;
  short port_local;
  int id_local;
  MP1Node *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"updating membership list ...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::size
                    (&this->memberNode->memberList);
  entry.timestamp._0_4_ = 0;
  while( true ) {
    if ((int)sVar3 <= (int)entry.timestamp) {
      iVar1 = Params::getcurrtime(this->par);
      MemberListEntry::MemberListEntry((MemberListEntry *)auStack_40,id,port,heartbeat,(long)iVar1);
      std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::push_back
                (&this->memberNode->memberList,(value_type *)auStack_40);
      Address::Address(&local_46);
      local_46.addr[0] = auStack_40[0];
      local_46.addr[1] = auStack_40[1];
      local_46.addr[2] = logAddr.addr[0];
      local_46.addr[3] = logAddr.addr[1];
      local_46.addr[4] = logAddr.addr[2];
      local_46.addr[5] = logAddr.addr[3];
      Log::logNodeAdd(this->log,&this->memberNode->addr,&local_46);
      poVar2 = std::operator<<((ostream *)&std::cout,"...end updateMembershipList.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      return;
    }
    pvVar4 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                       (&this->memberNode->memberList,(long)(int)entry.timestamp);
    if ((pvVar4->id == id) &&
       (pvVar4 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                           (&this->memberNode->memberList,(long)(int)entry.timestamp),
       pvVar4->port == port)) break;
    entry.timestamp._0_4_ = (int)entry.timestamp + 1;
  }
  pvVar4 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                     (&this->memberNode->memberList,(long)(int)entry.timestamp);
  lVar5 = MemberListEntry::getheartbeat(pvVar4);
  if (heartbeat <= lVar5) {
    return;
  }
  pvVar4 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                     (&this->memberNode->memberList,(long)(int)entry.timestamp);
  pvVar4->heartbeat = heartbeat;
  pvVar4 = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator[]
                     (&this->memberNode->memberList,(long)(int)entry.timestamp);
  iVar1 = Params::getcurrtime(this->par);
  MemberListEntry::settimestamp(pvVar4,(long)iVar1);
  return;
}

Assistant:

void MP1Node::updateMembershipList(int id, short port, long heartbeat) {
    cout << "updating membership list ..." << endl;

    int sizeOfMemberList = this->memberNode->memberList.size();
    for (int i = 0; i < sizeOfMemberList; i++) {
        if (memberNode->memberList[i].id == id && memberNode->memberList[i].port == port) {
            if (heartbeat > memberNode->memberList[i].getheartbeat()) {
                memberNode->memberList[i].heartbeat = heartbeat;
                memberNode->memberList[i].settimestamp(par->getcurrtime());
            }
            return;
        }
    }

    //if the memberlist does not contain the entry, create a new one and push it into the list
    MemberListEntry entry(id, port, heartbeat, par->getcurrtime());
    memberNode->memberList.push_back(entry);

#ifdef DEBUGLOG
    Address logAddr;
    memcpy(&logAddr.addr[0], &entry.id, sizeof(int));
    memcpy(&logAddr.addr[4], &entry.port, sizeof(short));
    log->logNodeAdd(&memberNode->addr, &logAddr);
#endif

    cout << "...end updateMembershipList." << endl;
}